

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void mnf::utils::hat2(Matrix3d *M,Vector3d *v)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  double v2v0;
  double v1v2;
  double local_68;
  ulong uStack_60;
  double local_58;
  double v0v1;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  double local_30;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_28;
  
  local_68 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[0];
  local_48 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[1];
  v0v1 = local_68 * local_48;
  local_58 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
  v1v2 = local_48 * local_58;
  uStack_60 = 0;
  v2v0 = local_68 * local_58;
  local_48 = local_48 * local_48;
  local_58 = local_58 * local_58;
  uStack_40 = 0;
  local_28.m_row = 0;
  local_28.m_col = 1;
  local_28.m_currentBlockRows = 1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       -local_48 - local_58;
  local_28.m_xpr = M;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_28,&v0v1);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&v2v0);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&v0v1);
  uStack_60 = uStack_60 ^ 0x8000000000000000;
  local_68 = -local_68 * local_68;
  local_30 = local_68 - local_58;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_30);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&v1v2);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&v2v0);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&v1v2);
  local_38 = local_68 - local_48;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_38);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::finished(&local_28);
  return;
}

Assistant:

void hat2(Eigen::Matrix3d& M, const Eigen::Vector3d& v)
{
  double v0v1 = v(0) * v(1);
  double v1v2 = v(1) * v(2);
  double v2v0 = v(2) * v(0);
  double v0_2 = v(0) * v(0);
  double v1_2 = v(1) * v(1);
  double v2_2 = v(2) * v(2);

  M << -v1_2 - v2_2, v0v1, v2v0, v0v1, -v0_2 - v2_2, v1v2, v2v0, v1v2,
      -v0_2 - v1_2;
}